

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O0

char * cvtToDependent(char *prepend,char *path,char *buf,size_t buflen)

{
  char *local_48;
  size_t buflen_local;
  char *buf_local;
  char *path_local;
  char *prepend_local;
  
  if (buf == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    prepend_local = (char *)0x0;
  }
  else {
    local_48 = prepend;
    if (prepend == (char *)0x0) {
      local_48 = "";
    }
    snprintf(buf,buflen,"%s%s",local_48,path);
    prepend_local = buf;
  }
  return prepend_local;
}

Assistant:

static char *cvtToDependent(const char *prepend, const char *path,
                            char *buf, const size_t buflen)
{
    BAIL_IF(buf == NULL, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    snprintf(buf, buflen, "%s%s", prepend ? prepend : "", path);

    #if !__PHYSFS_STANDARD_DIRSEP
    assert(__PHYSFS_platformDirSeparator != '/');
    {
        char *p;
        for (p = strchr(buf, '/'); p != NULL; p = strchr(p + 1, '/'))
            *p = __PHYSFS_platformDirSeparator;
    } /* if */
    #endif

    return buf;
}